

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_util.cc
# Opt level: O3

bool DoSplitHandshake(UniquePtr<SSL> *ssl,SettingsWriter *writer,bool is_resume)

{
  SSL *pSVar1;
  BIO *pBVar2;
  Span<const_unsigned_char> handback_00;
  __uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> *p_Var3;
  _Head_base<0UL,_ssl_session_st_*,_false> in;
  __uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> _Var4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  ushort uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  BIO *pBVar12;
  BIO *pBVar13;
  TestConfig *pTVar14;
  uint8_t *puVar15;
  size_t sVar16;
  SSL_CTX *pSVar17;
  TestState *pTVar18;
  uint8_t *puVar19;
  ssize_t sVar20;
  ulong uVar21;
  DTLS1_STATE *pDVar22;
  pair<const_int,_int> pVar23;
  size_type __new_size;
  ScopedFD SVar24;
  undefined7 in_register_00000011;
  value_type_conflict *__val;
  long lVar25;
  DTLS1_STATE *count;
  _Head_base<0UL,_ssl_ctx_st_*,_false> _Var26;
  char *pcVar27;
  _Head_base<0UL,_ssl_ctx_st_*,_false> _Var28;
  ulong uVar29;
  undefined1 *data;
  allocator_type *data_00;
  _Any_data *data_01;
  Span<const_unsigned_char> handoff;
  initializer_list<std::pair<const_int,_int>_> __l;
  initializer_list<int> __l_00;
  Span<const_unsigned_char> handback_01;
  char msg;
  ScopedFD control;
  ScopedProcess handshaker;
  ScopedFD wfd1_closer;
  ScopedFD rfd0_closer;
  uint8_t header [5];
  ScopedFD wfd0_closer;
  ScopedFD rfd1_closer;
  int rfd [2];
  int wfd [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> handshaker_input;
  CBS handback;
  UniquePtr<SSL> ssl_handback;
  CBS output;
  allocator_type local_23d;
  ScopedFD local_23c;
  undefined4 local_238;
  ScopedProcess local_234;
  ScopedFD local_230;
  ScopedFD local_22c;
  __uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> *local_228;
  allocator_type local_21d;
  char local_21c;
  ushort local_21a;
  ScopedFD local_218;
  ScopedFD local_214;
  int local_210;
  int local_20c;
  undefined1 local_208 [32];
  _Head_base<0UL,_ssl_session_st_*,_false> local_1e8;
  __uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> _Stack_1e0;
  long local_1d8;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_1d0;
  SettingsWriter *local_1c8;
  pointer local_1c0;
  pointer local_1b8;
  pointer local_1b0;
  ulong local_1a8;
  __uniq_ptr_impl<TestState,_std::default_delete<TestState>_> local_1a0;
  undefined1 local_198 [64];
  _Any_data local_158;
  code *local_148;
  code *local_140;
  undefined1 local_118 [88];
  UniquePtr<SSL_SESSION> local_c0;
  undefined1 local_b8 [32];
  uint8_t *local_98;
  size_t sStack_90;
  __uniq_ptr_impl<char,_bssl::internal::Deleter> local_88;
  SSL_QUIC_METHOD *pSStack_80;
  uint8_t *local_78;
  size_t sStack_70;
  uint8_t *local_68;
  size_t sStack_60;
  uint8_t *local_58;
  size_t sStack_50;
  uint8_t *local_48;
  size_t sStack_40;
  
  local_1c8 = writer;
  pBVar12 = SSL_get_rbio((SSL *)(ssl->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  pBVar13 = SSL_get_wbio((SSL *)(ssl->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  if (pBVar12 != pBVar13) {
    __assert_fail("SSL_get_rbio(ssl->get()) == SSL_get_wbio(ssl->get())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/handshake_util.cc"
                  ,0x29e,"bool DoSplitHandshake(UniquePtr<SSL> *, SettingsWriter *, bool)");
  }
  local_238 = (undefined4)CONCAT71(in_register_00000011,is_resume);
  local_1e8._M_head_impl = (ssl_session_st *)0x0;
  _Stack_1e0._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
       (tuple<ssl_session_st_*,_bssl::internal::Deleter>)
       (_Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>)0x0;
  local_1d8 = 0;
  local_208._16_8_ =
       GetTestConfig((ssl->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  pSVar1 = (SSL *)(ssl->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl;
  local_228 = (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> *)ssl;
  local_118._0_8_ = pSVar1;
  bssl::SSL_set_handoff_mode((SSL *)pSVar1,true);
  pTVar14 = GetTestConfig((SSL *)pSVar1);
  do {
    local_158._8_8_ = 0;
    local_158._M_unused._M_object = local_118;
    local_140 = std::
                _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/handshake_util.cc:639:9)>
                ::_M_invoke;
    local_148 = std::
                _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/handshake_util.cc:639:9)>
                ::_M_manager;
    iVar9 = CheckIdempotentError
                      ("SSL_do_handshake",(SSL *)local_118._0_8_,(function<int_()> *)&local_158);
    if (local_148 != (code *)0x0) {
      (*local_148)(&local_158,&local_158,__destroy_functor);
    }
    if ((iVar9 < 0) && (iVar10 = SSL_get_error((SSL *)local_118._0_8_,iVar9), iVar10 == 0x11))
    goto LAB_00124733;
  } while ((pTVar14->async == true) && (bVar6 = RetryAsync((SSL *)local_118._0_8_,iVar9), bVar6));
  if (iVar9 < 0) {
LAB_00124733:
    iVar9 = SSL_get_error((SSL *)local_118._0_8_,iVar9);
    if (iVar9 != 0x11) goto LAB_00124d29;
    CBB_zero((CBB *)local_198);
    iVar9 = CBB_init((CBB *)local_198,0x200);
    p_Var3 = local_228;
    if ((iVar9 == 0) ||
       (bVar6 = bssl::SSL_serialize_handoff
                          ((SSL *)local_118._0_8_,(CBB *)local_198,(SSL_CLIENT_HELLO *)local_b8),
       !bVar6)) {
LAB_0012485b:
      DoSplitHandshake();
      bVar6 = false;
    }
    else {
      puVar15 = CBB_data((CBB *)local_198);
      sVar16 = CBB_len((CBB *)local_198);
      handoff.size_ = sVar16;
      handoff.data_ = puVar15;
      bVar6 = SettingsWriter::WriteHandoff(local_1c8,handoff);
      if (!bVar6) goto LAB_0012485b;
      pSVar17 = (SSL_CTX *)SSL_get_SSL_CTX((SSL *)local_118._0_8_);
      bVar6 = SerializeContextState(pSVar17,(CBB *)local_198);
      if (!bVar6) goto LAB_0012485b;
      pTVar18 = GetTestState((SSL *)local_118._0_8_);
      bVar6 = TestState::Serialize(pTVar18,(CBB *)local_198);
      if (!bVar6) goto LAB_0012485b;
      puVar15 = CBB_data((CBB *)local_198);
      puVar19 = CBB_data((CBB *)local_198);
      sVar16 = CBB_len((CBB *)local_198);
      bVar6 = true;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1e8,puVar15,
                 puVar19 + sVar16);
    }
    CBB_cleanup((CBB *)local_198);
    if (!bVar6) goto LAB_00124d7d;
    pBVar12 = SSL_get_rbio((SSL *)(((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> *)
                                   &(p_Var3->_M_t).
                                    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>)->_M_t
                                  ).super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    _Var4._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
         (tuple<ssl_session_st_*,_bssl::internal::Deleter>)
         (tuple<ssl_session_st_*,_bssl::internal::Deleter>)_Stack_1e0;
    in._M_head_impl = local_1e8._M_head_impl;
    iVar9 = pipe(&local_210);
    if (iVar9 != 0) {
      perror("pipe");
      goto LAB_00124d7d;
    }
    local_22c.fd_ = local_210;
    local_214.fd_ = local_20c;
    iVar9 = pipe((int *)(local_208 + 8));
    if (iVar9 == 0) {
      local_218.fd_ = local_208._8_4_;
      local_230.fd_ = local_208._12_4_;
      local_234.pid_ = -1;
      local_23c.fd_ = 0xffffffff;
      local_b8._4_4_ = local_210;
      local_b8._0_4_ = 4;
      local_b8._12_4_ = local_208._12_4_;
      local_b8._8_4_ = 5;
      __l._M_len = 2;
      __l._M_array = (iterator)local_b8;
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 local_118,__l,(less<int> *)local_158._M_pod_data,&local_21d);
      local_198._0_4_ = local_20c;
      local_198._4_4_ = local_208._8_4_;
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)local_198;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)(local_118 + 0x48),__l_00,&local_23d);
      bVar6 = StartHandshaker(&local_234,&local_23c,(TestConfig *)local_208._16_8_,
                              (bool)(char)local_238,
                              (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)local_118,(vector<int,_std::allocator<int>_> *)(local_118 + 0x48));
      if ((void *)local_118._72_8_ != (void *)0x0) {
        operator_delete((void *)local_118._72_8_,
                        (long)local_c0._M_t.
                              super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl -
                        local_118._72_8_);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)local_118);
      if (!bVar6) goto LAB_00124edf;
      if (-1 < local_22c.fd_) {
        close(local_22c.fd_);
      }
      local_22c.fd_ = -1;
      if (-1 < local_230.fd_) {
        close(local_230.fd_);
      }
      local_230.fd_ = -1;
      sVar20 = write_eintr(local_23c.fd_,in._M_head_impl,
                           (long)_Var4._M_t.
                                 super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl -
                           (long)in._M_head_impl);
      if (sVar20 == -1) {
        pcVar27 = "write";
LAB_00124ed3:
        perror(pcVar27);
LAB_00124edf:
        _Var28._M_head_impl = (ssl_ctx_st *)0x0;
        _Var26._M_head_impl = (ssl_ctx_st *)0x0;
        pVar23.first = 0;
        pVar23.second = 0;
        bVar6 = false;
      }
      else {
        local_238 = CONCAT31(local_238._1_3_,
                             *(bool *)((long)&(((MockQuicTransport *)(local_208._16_8_ + 0x240))->
                                              read_levels_).
                                              super__Vector_base<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>
                                              ._M_impl.super__Vector_impl_data._M_start + 1));
        local_118._48_8_ = ZEXT48((uint)local_208._8_4_);
        uVar11 = local_208._8_4_ + 0x3f;
        if (-1 < (int)local_208._8_4_) {
          uVar11 = local_208._8_4_;
        }
        local_1d0._M_head_impl = (evp_pkey_st *)(ulong)(uint)local_23c.fd_;
        local_1a8 = 1L << ((byte)local_208._8_4_ & 0x3f);
        SVar24.fd_ = local_23c.fd_ + 0x3f;
        if (-1 < local_23c.fd_) {
          SVar24.fd_ = local_23c.fd_;
        }
        local_1b8 = (pointer)(1L << ((byte)local_23c.fd_ & 0x3f));
        local_1b0 = (pointer)(long)((int)uVar11 >> 6);
        local_1c0 = (pointer)(long)(SVar24.fd_ >> 6);
        SVar24.fd_ = local_23c.fd_;
        if (local_23c.fd_ < (int)local_208._8_4_) {
          SVar24.fd_ = local_208._8_4_;
        }
        local_208._28_4_ = SVar24.fd_ + 1;
        do {
          do {
            while( true ) {
              local_48 = (uint8_t *)0x0;
              sStack_40 = 0;
              local_58 = (uint8_t *)0x0;
              sStack_50 = 0;
              local_68 = (uint8_t *)0x0;
              sStack_60 = 0;
              local_78 = (uint8_t *)0x0;
              sStack_70 = 0;
              local_88._M_t.super__Tuple_impl<0UL,_char_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_char_*,_false>._M_head_impl =
                   (tuple<char_*,_bssl::internal::Deleter>)
                   (_Tuple_impl<0UL,_char_*,_bssl::internal::Deleter>)0x0;
              pSStack_80 = (SSL_QUIC_METHOD *)0x0;
              local_98 = (uint8_t *)0x0;
              sStack_90 = 0;
              local_b8._16_8_ = (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0;
              local_b8._24_8_ = (stack_st_void *)0x0;
              local_b8._0_4_ = 0;
              local_b8._4_4_ = 0;
              local_b8._8_8_ = (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0;
              *(ulong *)(local_b8 + (long)local_1b0 * 8) =
                   *(ulong *)(local_b8 + (long)local_1b0 * 8) | local_1a8;
              *(ulong *)(local_b8 + (long)local_1c0 * 8) =
                   *(ulong *)(local_b8 + (long)local_1c0 * 8) | (ulong)local_1b8;
              iVar9 = select(local_208._28_4_,(fd_set *)local_b8,(fd_set *)0x0,(fd_set *)0x0,
                             (timeval *)0x0);
              if (iVar9 == -1) {
                pcVar27 = "select";
                goto LAB_00124d1f;
              }
              if (((*(ulong *)(local_b8 + (long)local_1b0 * 8) & local_1a8) == 0) ||
                 (sVar20 = read_eintr((int)local_118._48_8_,local_198,0x40), sVar20 < 1)) break;
              data = local_198;
              do {
                uVar11 = BIO_write(pBVar12,data,(int)sVar20);
                if (uVar11 == 0) {
                  DoSplitHandshake();
                  goto LAB_00124e03;
                }
                if ((int)uVar11 < 0) {
                  if ((char)local_238 == '\0') {
                    DoSplitHandshake();
                    goto LAB_00124e03;
                  }
                  AsyncBioAllowWrite((BIO *)pBVar12,1);
                }
                else {
                  data = data + uVar11;
                  sVar20 = sVar20 - (ulong)uVar11;
                }
              } while (sVar20 != 0);
            }
          } while ((*(ulong *)(local_b8 + (long)local_1c0 * 8) & (ulong)local_1b8) == 0);
          sVar20 = read_eintr((int)local_1d0._M_head_impl,&local_23d,1);
          if (sVar20 != 1) {
            pcVar27 = "read";
            goto LAB_00124d1f;
          }
          if (local_23d != (allocator_type)0x52) {
            if (local_23d == (allocator_type)0x45) goto LAB_00124e03;
            if (local_23d == (allocator_type)0x48) {
              bVar6 = true;
            }
            else {
              bVar6 = false;
              fprintf(_stderr,"Unknown control message from handshaker: %c\n",
                      (ulong)(uint)(int)(char)local_23d);
            }
            goto LAB_00124e05;
          }
          if ((char)local_238 != '\0') {
            AsyncBioAllowRead((BIO *)pBVar12,5);
          }
          lVar25 = 5;
          data_00 = &local_21d;
          do {
            uVar11 = BIO_read(pBVar12,data_00,(int)lVar25);
            if ((int)uVar11 < 1) {
              DoSplitHandshake();
              goto LAB_00124e03;
            }
            uVar29 = (ulong)uVar11;
            uVar21 = write_eintr(local_20c,data_00,uVar29);
            if (uVar21 == 0xffffffffffffffff) goto LAB_00124d18;
            if (uVar21 != uVar29) goto LAB_00124dfc;
            data_00 = data_00 + uVar29;
            lVar25 = lVar25 - uVar29;
          } while (lVar25 != 0);
          if (local_21c != '\x03') {
            DoSplitHandshake();
            goto LAB_00124e03;
          }
          uVar8 = local_21a << 8 | local_21a >> 8;
          if (uVar8 != 0) {
            pDVar22 = (DTLS1_STATE *)(ulong)uVar8;
            do {
              count = (DTLS1_STATE *)0x40;
              if (pDVar22 < (DTLS1_STATE *)0x40) {
                count = pDVar22;
              }
              local_118._64_8_ = pDVar22;
              if ((char)local_238 != '\0') {
                AsyncBioAllowRead((BIO *)pBVar12,(size_t)count);
              }
              data_01 = &local_158;
              local_118._56_8_ = count;
              do {
                uVar11 = BIO_read(pBVar12,data_01,(int)count);
                uVar29 = (ulong)uVar11;
                if ((int)uVar11 < 1) {
                  DoSplitHandshake();
                  goto LAB_00124e03;
                }
                uVar21 = write_eintr(local_20c,data_01,uVar29);
                if (uVar21 == 0xffffffffffffffff) goto LAB_00124d18;
                if (uVar21 != uVar29) goto LAB_00124dfc;
                data_01 = (_Any_data *)((long)data_01 + uVar29);
                count = (DTLS1_STATE *)((long)count - uVar29);
              } while (count != (DTLS1_STATE *)0x0);
              pDVar22 = (DTLS1_STATE *)(local_118._64_8_ - local_118._56_8_);
            } while (pDVar22 != (DTLS1_STATE *)0x0);
          }
          local_23d = (allocator_type)0x57;
          sVar20 = write_eintr((int)local_1d0._M_head_impl,&local_23d,1);
        } while (sVar20 == 1);
LAB_00124d18:
        pcVar27 = "write";
LAB_00124d1f:
        perror(pcVar27);
LAB_00124e03:
        bVar6 = false;
LAB_00124e05:
        bVar7 = ScopedProcess::Wait(&local_234,(int *)local_198);
        if (!bVar7) {
          pcVar27 = "waitpid";
          goto LAB_00124ed3;
        }
        if ((bool)(local_198._0_4_ != 0 & bVar6)) {
          DoSplitHandshake();
          goto LAB_00124edf;
        }
        if (!bVar6) goto LAB_00124edf;
        pVar23 = (pair<const_int,_int>)operator_new(0x100000);
        local_b8._0_8_ = pVar23;
        local_b8._16_8_ = (long)pVar23 + 0x100000;
        memset((void *)pVar23,0,0x100000);
        local_b8._8_8_ = (long)pVar23 + 0x100000;
        __new_size = read_eintr(local_23c.fd_,(void *)pVar23,0x100000);
        bVar6 = __new_size != 0xffffffffffffffff;
        if (__new_size == 0xffffffffffffffff) {
          DoSplitHandshake();
          _Var28._M_head_impl = (ssl_ctx_st *)0x0;
          _Var26._M_head_impl = (ssl_ctx_st *)0x0;
          pVar23.first = 0;
          pVar23.second = 0;
        }
        else {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8,__new_size);
          _Var26._M_head_impl = (ssl_ctx_st *)local_b8._8_8_;
          _Var28._M_head_impl = (ssl_ctx_st *)local_b8._16_8_;
          pVar23 = (pair<const_int,_int>)local_b8._0_8_;
        }
      }
      ScopedFD::~ScopedFD(&local_23c);
      ScopedProcess::Reset(&local_234,-1);
      ScopedFD::~ScopedFD(&local_230);
      ScopedFD::~ScopedFD(&local_218);
    }
    else {
      perror("pipe");
      _Var28._M_head_impl = (ssl_ctx_st *)0x0;
      _Var26._M_head_impl = (ssl_ctx_st *)0x0;
      pVar23.first = 0;
      pVar23.second = 0;
      bVar6 = false;
    }
    ScopedFD::~ScopedFD(&local_214);
    ScopedFD::~ScopedFD(&local_22c);
    if (bVar6) {
      pSVar17 = (SSL_CTX *)
                SSL_get_SSL_CTX((SSL *)(((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> *)
                                        &(local_228->_M_t).
                                         super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>)
                                       ->_M_t).
                                       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
      local_1a0._M_t.super__Tuple_impl<0UL,_TestState_*,_std::default_delete<TestState>_>.
      super__Head_base<0UL,_TestState_*,_false>._M_head_impl =
           (tuple<TestState_*,_std::default_delete<TestState>_>)
           (_Tuple_impl<0UL,_TestState_*,_std::default_delete<TestState>_>)0x0;
      sVar16 = 0;
      TestConfig::NewSSL((TestConfig *)&local_158,(SSL_CTX *)local_208._16_8_,(SSL_SESSION *)pSVar17
                         ,(unique_ptr<TestState,_std::default_delete<TestState>_> *)0x0);
      std::unique_ptr<TestState,_std::default_delete<TestState>_>::~unique_ptr
                ((unique_ptr<TestState,_std::default_delete<TestState>_> *)&local_1a0);
      if ((SSL *)local_158._M_unused._0_8_ == (SSL *)0x0) {
LAB_00125122:
        bVar6 = false;
      }
      else {
        local_b8._8_8_ = (long)_Var26._M_head_impl - (long)pVar23;
        local_b8._0_8_ = pVar23;
        iVar9 = CBS_get_u24_length_prefixed((CBS *)local_b8,(CBS *)local_198);
        if ((iVar9 == 0) ||
           (bVar6 = DeserializeContextState((CBS *)local_b8,pSVar17),
           uVar5 = local_158._M_unused._0_8_, !bVar6)) {
LAB_0012511d:
          DoSplitHandshake();
          goto LAB_00125122;
        }
        TestState::Deserialize((TestState *)local_208,(CBS *)local_b8,pSVar17);
        bVar6 = SetTestState((SSL *)uVar5,
                             (unique_ptr<TestState,_std::default_delete<TestState>_> *)local_208);
        if ((!bVar6) ||
           ((pTVar18 = GetTestState((SSL *)local_158._M_unused._0_8_), pTVar18 == (TestState *)0x0
            || (handback_00.data_._4_4_ = local_198._4_4_, handback_00.data_._0_4_ = local_198._0_4_
               , handback_00.size_ = local_198._8_8_,
               bVar6 = SettingsWriter::WriteHandback(local_1c8,handback_00), !bVar6)))) {
          std::unique_ptr<TestState,_std::default_delete<TestState>_>::~unique_ptr
                    ((unique_ptr<TestState,_std::default_delete<TestState>_> *)local_208);
          goto LAB_0012511d;
        }
        handback_01.size_ = sVar16;
        handback_01.data_ = (uchar *)local_198._8_8_;
        bVar6 = bssl::SSL_apply_handback
                          ((bssl *)local_158._M_unused._0_8_,
                           (SSL *)CONCAT44(local_198._4_4_,local_198._0_4_),handback_01);
        std::unique_ptr<TestState,_std::default_delete<TestState>_>::~unique_ptr
                  ((unique_ptr<TestState,_std::default_delete<TestState>_> *)local_208);
        uVar5 = local_158._M_unused._0_8_;
        if (!bVar6) goto LAB_0012511d;
        pSVar1 = (SSL *)(((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> *)
                         &(local_228->_M_t).
                          super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>)->_M_t).
                        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl;
        pBVar12 = SSL_get_rbio(pSVar1);
        BIO_up_ref((BIO *)pBVar12);
        SSL_set0_rbio((SSL *)uVar5,(BIO *)pBVar12);
        pBVar12 = SSL_get_wbio(pSVar1);
        BIO_up_ref((BIO *)pBVar12);
        SSL_set0_wbio((SSL *)uVar5,(BIO *)pBVar12);
        SSL_set0_rbio((SSL *)pSVar1,(BIO *)0x0);
        SSL_set0_wbio((SSL *)pSVar1,(BIO *)0x0);
        pTVar18 = GetTestState((((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> *)
                                &(local_228->_M_t).
                                 super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>)->_M_t).
                               super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        pBVar2 = pTVar18->async_bio;
        pTVar18 = GetTestState((SSL *)local_158._M_unused._0_8_);
        pTVar18->async_bio = pBVar2;
        pTVar18 = GetTestState((((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> *)
                                &(local_228->_M_t).
                                 super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>)->_M_t).
                               super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        uVar5 = local_158._M_unused._0_8_;
        pTVar18->async_bio = (BIO *)0x0;
        local_158._M_unused._M_object = (SSL *)0x0;
        std::__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>::reset(local_228,(pointer)uVar5);
        bVar6 = true;
      }
      std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_158);
      goto LAB_00125131;
    }
  }
  else {
LAB_00124d29:
    fwrite("Handshake failed while waiting for handoff.\n",0x2c,1,_stderr);
LAB_00124d7d:
    _Var28._M_head_impl = (ssl_ctx_st *)0x0;
    pVar23.first = 0;
    pVar23.second = 0;
  }
  fwrite("Handoff failed.\n",0x10,1,_stderr);
  bVar6 = false;
LAB_00125131:
  if (pVar23 != (pair<const_int,_int>)0x0) {
    operator_delete((void *)pVar23,(long)_Var28._M_head_impl - (long)pVar23);
  }
  if ((_Head_base<0UL,_ssl_session_st_*,_false>)local_1e8._M_head_impl !=
      (_Head_base<0UL,_ssl_session_st_*,_false>)0x0) {
    operator_delete(local_1e8._M_head_impl,local_1d8 - (long)local_1e8._M_head_impl);
  }
  return bVar6;
LAB_00124dfc:
  fprintf(_stderr,"short write (%zd of %d bytes)\n",uVar21);
  goto LAB_00124e03;
}

Assistant:

bool DoSplitHandshake(UniquePtr<SSL> *ssl, SettingsWriter *writer,
                      bool is_resume) {
  assert(SSL_get_rbio(ssl->get()) == SSL_get_wbio(ssl->get()));
  std::vector<uint8_t> handshaker_input;
  const TestConfig *config = GetTestConfig(ssl->get());
  // out is the response from the handshaker, which includes a serialized
  // handback message, but also serialized updates to the |TestState|.
  std::vector<uint8_t> out;
  if (!PrepareHandoff(ssl->get(), writer, &handshaker_input) ||
      !RunHandshaker(SSL_get_rbio(ssl->get()), config, is_resume,
                     handshaker_input, &out)) {
    fprintf(stderr, "Handoff failed.\n");
    return false;
  }

  SSL_CTX *ctx = SSL_get_SSL_CTX(ssl->get());
  UniquePtr<SSL> ssl_handback = config->NewSSL(ctx, nullptr, nullptr);
  if (!ssl_handback) {
    return false;
  }
  CBS output, handback;
  CBS_init(&output, out.data(), out.size());
  if (!CBS_get_u24_length_prefixed(&output, &handback) ||
      !DeserializeContextState(&output, ctx) ||
      !SetTestState(ssl_handback.get(), TestState::Deserialize(&output, ctx)) ||
      !GetTestState(ssl_handback.get()) || !writer->WriteHandback(handback) ||
      !SSL_apply_handback(ssl_handback.get(), handback)) {
    fprintf(stderr, "Handback failed.\n");
    return false;
  }
  MoveBIOs(ssl_handback.get(), ssl->get());
  GetTestState(ssl_handback.get())->async_bio =
      GetTestState(ssl->get())->async_bio;
  GetTestState(ssl->get())->async_bio = nullptr;

  *ssl = std::move(ssl_handback);
  return true;
}